

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall
argstest::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  bool bVar1;
  int iVar2;
  OptionType OVar3;
  Options OVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  reference s;
  undefined4 extraout_var;
  ulong uVar5;
  reference ppCVar6;
  string *psVar7;
  reference ppFVar8;
  NamedBase *pNVar9;
  long lVar10;
  char *pcVar11;
  undefined4 extraout_var_01;
  ulong local_3b8;
  bool local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice_2;
  iterator __end0;
  iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range8;
  NamedBase *local_2d0;
  FlagBase *flag_2;
  undefined1 local_2c0 [7];
  value_type arg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice_1;
  iterator __end7;
  iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  EitherFlag local_228;
  NamedBase *local_200;
  FlagBase *flag_1;
  string arg;
  size_type separator;
  reference local_1b0;
  EitherFlag *flagName;
  __normal_iterator<argstest::EitherFlag_*,_std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>_>
  local_1a0;
  iterator __end6_1;
  iterator __begin6_1;
  vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *__range6_1;
  string local_148;
  Matcher *local_128;
  Matcher *matcher;
  FlagBase *flag;
  iterator __end4_1;
  iterator __begin4_1;
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *__range4_1;
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *choice;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  Command **cmd_1;
  iterator __end4;
  iterator __begin4;
  vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *__range4;
  bool hasPositionalCompletion;
  Command **cmd;
  iterator __end3;
  iterator __begin3;
  vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *__range3;
  undefined1 local_58 [4];
  OptionType optionType;
  vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> commands;
  PositionalBase *pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *chunk;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  nextIt;
  ArgumentParser *this_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_local;
  undefined4 extraout_var_00;
  
  if ((this->readCompletion & 1U) != 0) {
    chunk = it._M_current;
    nextIt._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    this_local = (ArgumentParser *)end._M_current;
    end_local = it;
    __lhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&chunk);
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&this_local);
    if (!bVar1) {
      s = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&end_local);
      iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
      commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
      (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(local_58);
      OVar3 = ParseOption(this,s,true);
      bVar1 = std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::empty
                        ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)
                         local_58);
      if ((bVar1) ||
         ((uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0 && (OVar3 != Positional)))) {
        local_389 = true;
        bVar1 = std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::empty
                          ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)
                           local_58);
        if (bVar1) {
          if (commands.super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            OVar4 = Base::GetOptions((Base *)commands.
                                             super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            OVar4 = operator&(OVar4,HiddenFromCompletion);
            if (OVar4 == None) {
              NamedBase::HelpChoices_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range6,
                         (NamedBase *)
                         commands.
                         super__Vector_base<argstest::Command_*,_std::allocator<argstest::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->helpParams);
              bVar1 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range6);
              local_389 = !bVar1 || OVar3 != Positional;
              __end6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range6);
              choice = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range6);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&choice), bVar1) {
                flags.
                super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)__gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&__end6);
                AddCompletionReply(this,s,(string *)
                                          flags.
                                          super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end6);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range6);
            }
          }
        }
        else {
          __end4 = std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::begin
                             ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)
                              local_58);
          cmd_1 = (Command **)
                  std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::end
                            ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)
                             local_58);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<argstest::Command_**,_std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>_>
                                             *)&cmd_1), bVar1) {
            choices.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<argstest::Command_**,_std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>_>
                          ::operator*(&__end4);
            OVar4 = Base::GetOptions((Base *)*(Command **)
                                              choices.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            OVar4 = operator&(OVar4,HiddenFromCompletion);
            if (OVar4 == None) {
              psVar7 = Command::Name_abi_cxx11_
                                 (*(Command **)
                                   choices.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              AddCompletionReply(this,s,psVar7);
            }
            __gnu_cxx::
            __normal_iterator<argstest::Command_**,_std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>_>
            ::operator++(&__end4);
          }
        }
        if (local_389) {
          (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&__range4_1);
          __end4_1 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::begin
                               ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
                                 *)&__range4_1);
          flag = (FlagBase *)
                 std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                           ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                            &__range4_1);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4_1,
                                    (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                                     *)&flag), bVar1) {
            ppFVar8 = __gnu_cxx::
                      __normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                      ::operator*(&__end4_1);
            matcher = (Matcher *)*ppFVar8;
            OVar4 = Base::GetOptions((Base *)matcher);
            OVar4 = operator&(OVar4,HiddenFromCompletion);
            if (OVar4 == None) {
              local_128 = FlagBase::GetMatcher((FlagBase *)matcher);
              Matcher::GetShortOrAny((EitherFlag *)&__range6_1,local_128);
              EitherFlag::str(&local_148,(EitherFlag *)&__range6_1,&this->shortprefix,
                              &this->longprefix);
              bVar1 = AddCompletionReply(this,s,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              EitherFlag::~EitherFlag((EitherFlag *)&__range6_1);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                Matcher::GetFlagStrings
                          ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *)
                           &__begin6_1,local_128);
                __end6_1 = std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>
                           ::begin((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>
                                    *)&__begin6_1);
                local_1a0._M_current =
                     (EitherFlag *)
                     std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>::end
                               ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>
                                 *)&__begin6_1);
                while (bVar1 = __gnu_cxx::operator!=(&__end6_1,&local_1a0), bVar1) {
                  local_1b0 = __gnu_cxx::
                              __normal_iterator<argstest::EitherFlag_*,_std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>_>
                              ::operator*(&__end6_1);
                  EitherFlag::str((string *)&separator,local_1b0,&this->shortprefix,
                                  &this->longprefix);
                  bVar1 = AddCompletionReply(this,s,(string *)&separator);
                  std::__cxx11::string::~string((string *)&separator);
                  if (bVar1) break;
                  __gnu_cxx::
                  __normal_iterator<argstest::EitherFlag_*,_std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>_>
                  ::operator++(&__end6_1);
                }
                flagName._4_4_ = 10;
                std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>::~vector
                          ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *)
                           &__begin6_1);
              }
            }
            __gnu_cxx::
            __normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
            ::operator++(&__end4_1);
          }
          if ((OVar3 == LongFlag) && ((this->allowJoinedLongValue & 1U) != 0)) {
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              local_3b8 = std::__cxx11::string::find((string *)s,(ulong)&this->longseparator);
            }
            else {
              local_3b8 = 0xffffffffffffffff;
            }
            arg.field_2._8_8_ = local_3b8;
            if (local_3b8 != 0xffffffffffffffff) {
              std::__cxx11::string::string((string *)&flag_1,(string *)s,0,local_3b8);
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)&__range7,(ulong)&flag_1);
              EitherFlag::EitherFlag(&local_228,(string *)&__range7);
              iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&local_228)
              ;
              pNVar9 = (NamedBase *)CONCAT44(extraout_var_00,iVar2);
              EitherFlag::~EitherFlag(&local_228);
              std::__cxx11::string::~string((string *)&__range7);
              local_200 = pNVar9;
              if (pNVar9 != (NamedBase *)0x0) {
                NamedBase::HelpChoices_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__begin7,pNVar9,&this->helpParams);
                __end7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&__begin7);
                choice_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&__begin7);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&__end7,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&choice_1), bVar1) {
                  local_280 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&__end7);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2c0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&flag_1,&this->longseparator);
                  std::operator+(&local_2a0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2c0,local_280);
                  AddCompletionReply(this,s,&local_2a0);
                  std::__cxx11::string::~string((string *)&local_2a0);
                  std::__cxx11::string::~string((string *)local_2c0);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&__end7);
                }
                flagName._4_4_ = 0xc;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__begin7);
              }
              std::__cxx11::string::~string((string *)&flag_1);
            }
          }
          else if ((OVar3 == ShortFlag) && ((this->allowJoinedShortValue & 1U) != 0)) {
            uVar5 = std::__cxx11::string::size();
            lVar10 = std::__cxx11::string::size();
            if (lVar10 + 1U < uVar5) {
              std::__cxx11::string::size();
              pcVar11 = (char *)std::__cxx11::string::at((ulong)s);
              flag_2._7_1_ = *pcVar11;
              EitherFlag::EitherFlag((EitherFlag *)&__range8,flag_2._7_1_);
              iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&__range8);
              pNVar9 = (NamedBase *)CONCAT44(extraout_var_01,iVar2);
              EitherFlag::~EitherFlag((EitherFlag *)&__range8);
              local_2d0 = pNVar9;
              if (pNVar9 != (NamedBase *)0x0) {
                NamedBase::HelpChoices_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__begin0,pNVar9,&this->helpParams);
                __end0 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&__begin0);
                choice_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&__begin0);
                while (bVar1 = __gnu_cxx::operator!=
                                         (&__end0,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&choice_2), bVar1) {
                  local_330 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&__end0);
                  std::operator+(&local_370,&this->shortprefix,flag_2._7_1_);
                  std::operator+(&local_350,&local_370,local_330);
                  AddCompletionReply(this,s,&local_350);
                  std::__cxx11::string::~string((string *)&local_350);
                  std::__cxx11::string::~string((string *)&local_370);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&__end0);
                }
                flagName._4_4_ = 0xe;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__begin0);
              }
            }
          }
          std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~vector
                    ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                     &__range4_1);
        }
      }
      else {
        __end3 = std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::begin
                           ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)
                            local_58);
        cmd = (Command **)
              std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::end
                        ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)
                         local_58);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<argstest::Command_**,_std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>_>
                                           *)&cmd), bVar1) {
          ppCVar6 = __gnu_cxx::
                    __normal_iterator<argstest::Command_**,_std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>_>
                    ::operator*(&__end3);
          OVar4 = Base::GetOptions((Base *)*ppCVar6);
          OVar4 = operator&(OVar4,HiddenFromCompletion);
          if (OVar4 == None) {
            psVar7 = Command::Name_abi_cxx11_(*ppCVar6);
            AddCompletionReply(this,s,psVar7);
          }
          __gnu_cxx::
          __normal_iterator<argstest::Command_**,_std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>_>
          ::operator++(&__end3);
        }
      }
      flagName._4_4_ = 1;
      std::vector<argstest::Command_*,_std::allocator<argstest::Command_*>_>::~vector
                ((vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> *)local_58);
      return true;
    }
  }
  return false;
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }